

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::CalcTypematicRepeatAmount(float t0,float t1,float repeat_delay,float repeat_rate)

{
  int local_34;
  int local_30;
  bool local_29;
  int count;
  int count_t1;
  int count_t0;
  float repeat_rate_local;
  float repeat_delay_local;
  float t1_local;
  float t0_local;
  
  if ((t1 != 0.0) || (NAN(t1))) {
    if (t0 < t1) {
      if (0.0 < repeat_rate) {
        if (repeat_delay <= t0) {
          local_30 = (int)((t0 - repeat_delay) / repeat_rate);
        }
        else {
          local_30 = -1;
        }
        if (repeat_delay <= t1) {
          local_34 = (int)((t1 - repeat_delay) / repeat_rate);
        }
        else {
          local_34 = -1;
        }
        t1_local = (float)(local_34 - local_30);
      }
      else {
        local_29 = t0 < repeat_delay && repeat_delay <= t1;
        t1_local = (float)(uint)local_29;
      }
    }
    else {
      t1_local = 0.0;
    }
  }
  else {
    t1_local = 1.4013e-45;
  }
  return (int)t1_local;
}

Assistant:

int ImGui::CalcTypematicRepeatAmount(float t0, float t1, float repeat_delay, float repeat_rate)
{
    if (t1 == 0.0f)
        return 1;
    if (t0 >= t1)
        return 0;
    if (repeat_rate <= 0.0f)
        return (t0 < repeat_delay) && (t1 >= repeat_delay);
    const int count_t0 = (t0 < repeat_delay) ? -1 : (int)((t0 - repeat_delay) / repeat_rate);
    const int count_t1 = (t1 < repeat_delay) ? -1 : (int)((t1 - repeat_delay) / repeat_rate);
    const int count = count_t1 - count_t0;
    return count;
}